

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O0

void absl::lts_20250127::functional_internal::
     InvokeObject<google::protobuf::DescriptorPool::BuildFileFromDatabase(google::protobuf::FileDescriptorProto_const&,google::protobuf::DescriptorPool::DeferredValidation&)const::__0,void>
               (VoidPtr ptr)

{
  anon_class_32_4_3cd23a31 *o;
  VoidPtr ptr_local;
  
  std::
  invoke<google::protobuf::DescriptorPool::BuildFileFromDatabase(google::protobuf::FileDescriptorProto_const&,google::protobuf::DescriptorPool::DeferredValidation&)const::__0_const&>
            ((anon_class_32_4_3cd23a31 *)ptr.obj);
  return;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}